

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockfilter_tests.cpp
# Opt level: O2

void __thiscall
blockfilter_tests::gcsfilter_default_constructor::test_method(gcsfilter_default_constructor *this)

{
  long lVar1;
  iterator in_R8;
  iterator pvVar2;
  iterator in_R9;
  ulong *puVar3;
  GCSFilter *pGVar4;
  uint64_t *puVar5;
  uint8_t *puVar6;
  long in_FS_OFFSET;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  char *local_1c8;
  char *local_1c0;
  undefined1 *local_1b8;
  undefined1 *local_1b0;
  char *local_1a8;
  char *local_1a0;
  char *local_198;
  char *local_190;
  undefined1 *local_188;
  undefined1 *local_180;
  char *local_178;
  char *local_170;
  char *local_168;
  char *local_160;
  undefined1 *local_158;
  undefined1 *local_150;
  char *local_148;
  char *local_140;
  char *local_138;
  char *local_130;
  undefined1 *local_128;
  undefined1 *local_120;
  char *local_118;
  char *local_110;
  ulong local_108;
  char *local_100;
  char *local_f8;
  undefined1 *local_f0;
  undefined1 *local_e8;
  char *local_e0;
  char *local_d8;
  undefined4 local_cc;
  char *local_c8;
  char *local_c0;
  undefined1 local_b8 [20];
  uint32_t uStack_a4;
  char *local_a0;
  undefined1 *local_98;
  undefined1 *local_90;
  char *local_88;
  char *local_80;
  GCSFilter filter;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_b8._0_8_ = 0;
  local_b8._8_8_ = 0;
  local_b8._16_4_ = local_b8._16_4_ & 0xffffff00;
  uStack_a4 = 1;
  GCSFilter::GCSFilter(&filter,(Params *)local_b8);
  local_88 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockfilter_tests.cpp"
  ;
  local_80 = "";
  local_98 = &boost::unit_test::basic_cstring<char_const>::null;
  local_90 = &boost::unit_test::basic_cstring<char_const>::null;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  file.m_end = (iterator)0x2f;
  file.m_begin = (iterator)&local_88;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_98,msg);
  local_b8._8_8_ = local_b8._8_8_ & 0xffffffffffffff00;
  local_b8._0_8_ = &PTR__lazy_ostream_01139f30;
  stack0xffffffffffffff58 = boost::unit_test::lazy_ostream::inst;
  local_a0 = "";
  local_c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockfilter_tests.cpp"
  ;
  local_c0 = "";
  puVar3 = &local_108;
  local_108 = CONCAT44(local_108._4_4_,filter.m_N);
  local_cc = 0;
  pvVar2 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
            (local_b8,&local_c8,0x2f,1,2,puVar3,"filter.GetN()",&local_cc,"0U");
  local_e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockfilter_tests.cpp"
  ;
  local_d8 = "";
  local_f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_e8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_00.m_end = (iterator)puVar3;
  msg_00.m_begin = pvVar2;
  file_00.m_end = (iterator)0x30;
  file_00.m_begin = (iterator)&local_e0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_f0,msg_00
            );
  local_b8._8_8_ = local_b8._8_8_ & 0xffffffffffffff00;
  local_b8._0_8_ = &PTR__lazy_ostream_01139f30;
  stack0xffffffffffffff58 = boost::unit_test::lazy_ostream::inst;
  local_a0 = "";
  local_100 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockfilter_tests.cpp"
  ;
  local_108 = (long)filter.m_encoded.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)filter.m_encoded.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start;
  local_f8 = "";
  local_cc = 1;
  pvVar2 = (iterator)0x2;
  puVar3 = &local_108;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
            (local_b8,&local_100,0x30,1,2,&local_108,"filter.GetEncoded().size()",&local_cc,"1U");
  local_118 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockfilter_tests.cpp"
  ;
  local_110 = "";
  local_128 = &boost::unit_test::basic_cstring<char_const>::null;
  local_120 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_01.m_end = (iterator)puVar3;
  msg_01.m_begin = pvVar2;
  file_01.m_end = (iterator)0x33;
  file_01.m_begin = (iterator)&local_118;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_128,
             msg_01);
  local_b8._8_8_ = local_b8._8_8_ & 0xffffffffffffff00;
  local_b8._0_8_ = &PTR__lazy_ostream_01139f30;
  stack0xffffffffffffff58 = boost::unit_test::lazy_ostream::inst;
  local_a0 = "";
  local_138 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockfilter_tests.cpp"
  ;
  local_130 = "";
  local_108 = local_108 & 0xffffffff00000000;
  pvVar2 = (iterator)0x2;
  pGVar4 = &filter;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
            (local_b8,&local_138,0x33,1,2,pGVar4,"params.m_siphash_k0",&local_108,"0U");
  local_148 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockfilter_tests.cpp"
  ;
  local_140 = "";
  local_158 = &boost::unit_test::basic_cstring<char_const>::null;
  local_150 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_02.m_end = (iterator)pGVar4;
  msg_02.m_begin = pvVar2;
  file_02.m_end = (iterator)0x34;
  file_02.m_begin = (iterator)&local_148;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_158,
             msg_02);
  local_b8._8_8_ = local_b8._8_8_ & 0xffffffffffffff00;
  local_b8._0_8_ = &PTR__lazy_ostream_01139f30;
  stack0xffffffffffffff58 = boost::unit_test::lazy_ostream::inst;
  local_a0 = "";
  local_168 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockfilter_tests.cpp"
  ;
  local_160 = "";
  puVar5 = &filter.m_params.m_siphash_k1;
  local_108 = local_108 & 0xffffffff00000000;
  pvVar2 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
            (local_b8,&local_168,0x34,1,2,puVar5,"params.m_siphash_k1",&local_108,"0U");
  local_178 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockfilter_tests.cpp"
  ;
  local_170 = "";
  local_188 = &boost::unit_test::basic_cstring<char_const>::null;
  local_180 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_03.m_end = (iterator)puVar5;
  msg_03.m_begin = pvVar2;
  file_03.m_end = (iterator)0x35;
  file_03.m_begin = (iterator)&local_178;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_188,
             msg_03);
  local_b8._8_8_ = local_b8._8_8_ & 0xffffffffffffff00;
  local_b8._0_8_ = &PTR__lazy_ostream_01139f30;
  stack0xffffffffffffff58 = boost::unit_test::lazy_ostream::inst;
  local_a0 = "";
  local_198 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockfilter_tests.cpp"
  ;
  local_190 = "";
  puVar6 = &filter.m_params.m_P;
  local_108 = local_108 & 0xffffffff00000000;
  pvVar2 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_char,int>
            (local_b8,&local_198,0x35,1,2,puVar6,"params.m_P",&local_108,"0");
  local_1a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockfilter_tests.cpp"
  ;
  local_1a0 = "";
  local_1b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1b0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_04.m_end = (iterator)puVar6;
  msg_04.m_begin = pvVar2;
  file_04.m_end = (iterator)0x36;
  file_04.m_begin = (iterator)&local_1a8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_1b8,
             msg_04);
  local_b8._8_8_ = local_b8._8_8_ & 0xffffffffffffff00;
  local_b8._0_8_ = &PTR__lazy_ostream_01139f30;
  stack0xffffffffffffff58 = boost::unit_test::lazy_ostream::inst;
  local_a0 = "";
  local_1c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockfilter_tests.cpp"
  ;
  local_1c0 = "";
  local_108 = CONCAT44(local_108._4_4_,1);
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
            (local_b8,&local_1c8,0x36,1,2,&filter.m_params.m_M,"params.m_M",&local_108,"1U");
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&filter.m_encoded.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(gcsfilter_default_constructor)
{
    GCSFilter filter;
    BOOST_CHECK_EQUAL(filter.GetN(), 0U);
    BOOST_CHECK_EQUAL(filter.GetEncoded().size(), 1U);

    const GCSFilter::Params& params = filter.GetParams();
    BOOST_CHECK_EQUAL(params.m_siphash_k0, 0U);
    BOOST_CHECK_EQUAL(params.m_siphash_k1, 0U);
    BOOST_CHECK_EQUAL(params.m_P, 0);
    BOOST_CHECK_EQUAL(params.m_M, 1U);
}